

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlv.cpp
# Opt level: O0

Error * ot::commissioner::tlv::GetTlvListByType
                  (Error *__return_storage_ptr__,TlvList *aTlvList,ByteArray *aBuf,Type aTlvType,
                  Scope aScope)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  Type TVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  element_type *peVar6;
  utils *this;
  ByteArray *aBytes;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar7;
  format_args args;
  string_view fmt;
  int local_194;
  string local_190;
  v10 local_16c [2];
  anon_class_1_0_00000001 local_16a;
  v10 local_169;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_168;
  char *local_160;
  string local_158;
  allocator local_131;
  string local_130;
  ErrorCode local_110 [4];
  undefined1 local_100 [8];
  TlvPtr tlvPtr;
  size_t offset;
  Scope aScope_local;
  Type aTlvType_local;
  ByteArray *aBuf_local;
  TlvList *aTlvList_local;
  Error *error;
  undefined1 local_a8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  char *local_90;
  string *local_88;
  v10 *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  char *pcStack_70;
  string *local_68;
  v10 *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  char *pcStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  Error **local_10;
  
  bVar1 = false;
  Error::Error(__return_storage_ptr__);
  tlvPtr.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::list<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>::clear
            (aTlvList);
  do {
    _Var2._M_pi = tlvPtr.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(aBuf);
    if (p_Var5 <= _Var2._M_pi) goto LAB_00244d79;
    Tlv::Deserialize((Tlv *)local_100,__return_storage_ptr__,
                     (size_t *)
                     &tlvPtr.
                      super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,aBuf,aScope);
    local_110[0] = kNone;
    bVar3 = commissioner::operator!=(__return_storage_ptr__,local_110);
    if (bVar3) {
      local_194 = 6;
    }
    else {
      bVar3 = std::operator!=((shared_ptr<ot::commissioner::tlv::Tlv> *)local_100,(nullptr_t)0x0);
      if (!bVar3) {
        abort();
      }
      peVar6 = std::
               __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_100);
      bVar3 = Tlv::IsValid(peVar6);
      if (bVar3) {
        peVar6 = std::
                 __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_100);
        TVar4 = Tlv::GetType(peVar6);
        if (TVar4 != aTlvType) goto LAB_00244aa2;
        peVar6 = std::
                 __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_100);
        std::__cxx11::list<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>
        ::push_back(aTlvList,peVar6);
      }
      else {
LAB_00244aa2:
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_130,"coap",&local_131);
        GetTlvListByType::anon_class_1_0_00000001::operator()(&local_16a);
        local_58 = &local_168;
        local_60 = &local_169;
        bVar7 = ::fmt::v10::operator()(local_60);
        local_160 = (char *)bVar7.size_;
        local_168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar7.data_
        ;
        ::fmt::v10::detail::
        check_format_string<unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FMT_COMPILE_STRING,_0>
                  ();
        peVar6 = std::
                 __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_100);
        TVar4 = Tlv::GetType(peVar6);
        local_16c[0] = (v10)utils::to_underlying<ot::commissioner::tlv::Type>(TVar4);
        peVar6 = std::
                 __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_100);
        this = (utils *)Tlv::GetValue(peVar6);
        utils::Hex_abi_cxx11_(&local_190,this,aBytes);
        local_68 = &local_158;
        local_78 = local_168;
        pcStack_70 = local_160;
        local_80 = local_16c;
        local_88 = &local_190;
        local_50 = &local_78;
        local_98 = local_168;
        local_90 = local_160;
        local_48 = local_98;
        pcStack_40 = local_90;
        ::fmt::v10::
        make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_char,std::__cxx11::string>
                  ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&error,local_80,(uchar *)local_88,local_168);
        local_30 = local_a8;
        local_38 = &error;
        local_20 = 0xd2;
        args.field_1.values_ = in_R9.values_;
        args.desc_ = (unsigned_long_long)local_38;
        fmt.size_ = 0xd2;
        fmt.data_ = local_90;
        local_28 = local_38;
        local_18 = local_30;
        local_10 = local_38;
        ::fmt::v10::vformat_abi_cxx11_(&local_158,(v10 *)local_98,fmt,args);
        Log(kWarn,&local_130,&local_158);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_130);
        std::allocator<char>::~allocator((allocator<char> *)&local_131);
      }
      local_194 = 0;
    }
    std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_100);
  } while (local_194 == 0);
  if (local_194 == 6) {
LAB_00244d79:
    bVar1 = true;
  }
  if (!bVar1) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error GetTlvListByType(TlvList &aTlvList, const ByteArray &aBuf, tlv::Type aTlvType, Scope aScope)
{
    Error  error;
    size_t offset = 0;

    aTlvList.clear();

    while (offset < aBuf.size())
    {
        auto tlvPtr = tlv::Tlv::Deserialize(error, offset, aBuf, aScope);
        SuccessOrExit(error);
        VerifyOrDie(tlvPtr != nullptr);

        if (tlvPtr->IsValid() && tlvPtr->GetType() == aTlvType)
        {
            aTlvList.push_back(*tlvPtr);
        }
        else
        {
            // Drop invalid TLVs
            LOG_WARN(LOG_REGION_COAP, "dropping invalid/unknown TLV(type={}, value={})",
                     utils::to_underlying(tlvPtr->GetType()), utils::Hex(tlvPtr->GetValue()));
        }
    }

exit:
    return error;
}